

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O3

value_type * __thiscall
nonstd::optional_lite::optional<std::__cxx11::string>::value_or<char_const(&)[1]>
          (value_type *__return_storage_ptr__,optional<std::__cxx11::string> *this,char (*v) [1])

{
  size_t sVar1;
  
  if (*this == (optional<std::__cxx11::string>)0x1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*(long *)(this + 8),
               *(long *)(this + 0x10) + *(long *)(this + 8));
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = strlen(*v);
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,v,v + sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

optional_constexpr value_type value_or( U && v ) const optional_ref_qual
    {
        return has_value() ? contained.value() : static_cast<T>(std::forward<U>( v ) );
    }